

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cones.h
# Opt level: O2

bool __thiscall
mp::
Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::AddRotatedQC(Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *this,QuadTerms *qpterms,LinTerms *lint,double rhs,int iDiffVars)

{
  double dVar1;
  value_type vVar2;
  ptr ppVar3;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  *this_00;
  reference pvVar4;
  reference pvVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type __n;
  NodeRange NVar9;
  allocator_type local_129;
  vector<double,_std::allocator<double>_> c;
  vector<int,_std::allocator<int>_> x;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  _Vector_base<int,_std::allocator<int>_> local_98;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  local_80;
  
  __n = 1;
  lVar8 = (ulong)(rhs != 0.0) + 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&x,(qpterms->folded_).
                super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                .m_data.
                super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                .m_size + lVar8 +
                (lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_size,(allocator_type *)&c);
  std::vector<double,_std::allocator<double>_>::vector
            (&c,lVar8 + (qpterms->folded_).
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_size +
                (lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_size,&local_129);
  if ((lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
      super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
    *x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         *(lint->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
    NVar9 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(&((this->
                             super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                             ).mc_)->
                            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ,1.0);
    x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] =
         NVar9.ir_.beg_;
    *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = ABS(*(lint->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr) * 0.5;
    c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
    [1] = 1.0;
  }
  uVar6 = (ulong)(uint)iDiffVars;
  lVar8 = 0;
  for (lVar7 = 0;
      lVar7 < (int)(qpterms->folded_).
                   super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                   .m_data.
                   super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                   .m_size; lVar7 = lVar7 + 1) {
    if (uVar6 * 0x10 == lVar8) {
      ppVar3 = (qpterms->folded_).
               super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>.
               m_data.
               super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
               .m_data_ptr;
      *x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           ppVar3[uVar6].first.first;
      x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] =
           ppVar3[uVar6].first.second;
      *c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = ABS(ppVar3[uVar6].second);
      c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [1] = 0.5;
    }
    else {
      __n = __n + 1;
      vVar2 = *(value_type *)
               ((long)&(((qpterms->folded_).
                         super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                         .m_data.
                         super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                        .m_data_ptr)->first).first + lVar8);
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(&x,__n);
      *pvVar4 = vVar2;
      dVar1 = *(double *)
               ((long)&((qpterms->folded_).
                        super_small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        .m_data.
                        super_small_vector_data_base<std::pair<std::pair<int,_int>,_double>_*,_unsigned_long>
                       .m_data_ptr)->second + lVar8);
      pvVar5 = std::vector<double,_std::allocator<double>_>::at(&c,__n);
      *pvVar5 = SQRT(ABS(dVar1));
    }
    lVar8 = lVar8 + 0x10;
  }
  if ((rhs != 0.0) || (NAN(rhs))) {
    NVar9 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::MakeFixedVar(&((this->
                             super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                             ).mc_)->
                            super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                           ,1.0);
    pvVar4 = std::vector<int,_std::allocator<int>_>::at(&x,__n + 1);
    *pvVar4 = NVar9.ir_.beg_;
    pvVar5 = std::vector<double,_std::allocator<double>_>::at(&c,__n + 1);
    *pvVar5 = SQRT(ABS(rhs));
  }
  this_00 = (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
             *)(this->
               super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               ).mc_;
  local_98._M_impl.super__Vector_impl_data._M_start =
       x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_98._M_impl.super__Vector_impl_data._M_finish =
       x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage =
       x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  x.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start =
       c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_b8._M_impl.super__Vector_impl_data._M_finish =
       c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage =
       c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  ::CustomStaticConstraint(&local_80,(Arguments *)&local_98,(Parameters *)&local_b8);
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>
  ::
  AddConstraint<mp::CustomStaticConstraint<std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::RotatedQuadraticConeId>>
            (this_00,&local_80);
  CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::RotatedQuadraticConeId>
  ::~CustomStaticConstraint(&local_80);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_98);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&c.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&x.super__Vector_base<int,_std::allocator<int>_>);
  return true;
}

Assistant:

bool AddRotatedQC(const QuadTerms& qpterms,
                    const LinTerms& lint,
                    double rhs, int iDiffVars) {
    assert(lint.size() + (iDiffVars>=0) <= 1);
    const auto rhsNon0 = (std::fabs(rhs)!=0.0);
    std::vector<int> x(qpterms.size()+1+lint.size()+rhsNon0);
    std::vector<double> c(qpterms.size()+1+lint.size()+rhsNon0);
    size_t iPush=1;
    if (lint.size()) {
      x[0] = lint.var(0);
      x[1] = int( MC().MakeFixedVar( 1.0 ) );
      c[0] = std::fabs(lint.coef(0)) / 2.0;
      c[1] = 1.0;      // it's 2xy >= z^2 + ...
    }
    for (int i=0; i<(int)qpterms.size(); ++i) {
      if (i==iDiffVars) {
        x[0] = qpterms.var1(i);
        x[1] = qpterms.var2(i);
        c[0] = std::fabs(qpterms.coef(i));
        c[1] = 0.5;           // it's 2xy >= z^2 + ...
      } else {
        ++iPush;
        x.at(iPush) = qpterms.var1(i);
        c.at(iPush) = std::sqrt(std::fabs(qpterms.coef(i)));
      }
    }
    if (rhsNon0) {            // Add  ... >= ... + |rhs|
      ++iPush;
      x.at(iPush) = int( MC().MakeFixedVar( 1.0 ) );
      c.at(iPush) = std::sqrt( std::fabs(rhs) );
    }
    assert(iPush == x.size()-1);
    MC().AddConstraint(
          RotatedQuadraticConeConstraint(
            std::move(x), std::move(c)));
    return true;
  }